

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManCollectTopXors_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vXors)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int iObj;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Vec_Int_t *vXors_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  pFan0 = (Gia_Obj_t *)vXors;
  vXors_local = (Vec_Int_t *)pObj;
  pObj_local = (Gia_Obj_t *)p;
  iVar2 = Gia_ObjId(p,pObj);
  iVar3 = Gia_ObjRecognizeExor
                    ((Gia_Obj_t *)vXors_local,&pFan1,(Gia_Obj_t **)&stack0xffffffffffffffd0);
  if ((iVar3 != 0) || (iVar3 = Gia_ObjIsAnd((Gia_Obj_t *)vXors_local), iVar3 == 0)) {
    pGVar4 = pFan0;
    iVar2 = Gia_ObjId((Gia_Man_t *)pObj_local,(Gia_Obj_t *)vXors_local);
    Vec_IntPushUnique((Vec_Int_t *)pGVar4,iVar2);
    return;
  }
  iVar3 = Gia_ObjFaninC0((Gia_Obj_t *)vXors_local);
  pGVar1 = pObj_local;
  pGVar4 = pFan0;
  if (iVar3 == 0) {
    pGVar4 = Gia_ObjFanin0((Gia_Obj_t *)vXors_local);
    Gia_ManCollectTopXors_rec((Gia_Man_t *)pGVar1,pGVar4,(Vec_Int_t *)pFan0);
  }
  else {
    iVar3 = Gia_ObjFaninId0((Gia_Obj_t *)vXors_local,iVar2);
    Vec_IntPushUnique((Vec_Int_t *)pGVar4,iVar3);
  }
  iVar3 = Gia_ObjFaninC1((Gia_Obj_t *)vXors_local);
  pGVar1 = pObj_local;
  pGVar4 = pFan0;
  if (iVar3 != 0) {
    iVar2 = Gia_ObjFaninId1((Gia_Obj_t *)vXors_local,iVar2);
    Vec_IntPushUnique((Vec_Int_t *)pGVar4,iVar2);
    return;
  }
  pGVar4 = Gia_ObjFanin1((Gia_Obj_t *)vXors_local);
  Gia_ManCollectTopXors_rec((Gia_Man_t *)pGVar1,pGVar4,(Vec_Int_t *)pFan0);
  return;
}

Assistant:

void Gia_ManCollectTopXors_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vXors )
{
    Gia_Obj_t * pFan0, * pFan1;
    int iObj = Gia_ObjId( p, pObj );
    if ( Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) || !Gia_ObjIsAnd(pObj) )
    {
        Vec_IntPushUnique( vXors, Gia_ObjId(p, pObj) );
        return;
    }
    if ( Gia_ObjFaninC0(pObj) )
        Vec_IntPushUnique( vXors, Gia_ObjFaninId0(pObj, iObj) );
    else
        Gia_ManCollectTopXors_rec( p, Gia_ObjFanin0(pObj), vXors );
    if ( Gia_ObjFaninC1(pObj) )
        Vec_IntPushUnique( vXors, Gia_ObjFaninId1(pObj, iObj) );
    else
        Gia_ManCollectTopXors_rec( p, Gia_ObjFanin1(pObj), vXors );
}